

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinc_resampler.cc
# Opt level: O0

void __thiscall webrtc::SincResampler::SetRatio(SincResampler *this,double io_sample_rate_ratio)

{
  float fVar1;
  float fVar2;
  size_t __i;
  type pfVar3;
  double dVar4;
  double dVar5;
  double local_60;
  float pre_sinc;
  float window;
  size_t idx;
  size_t i;
  size_t offset_idx;
  double sinc_scale_factor;
  double io_sample_rate_ratio_local;
  SincResampler *this_local;
  
  dVar5 = this->io_sample_rate_ratio_;
  dVar4 = std::numeric_limits<double>::epsilon();
  if (dVar4 <= ABS(dVar5 - io_sample_rate_ratio)) {
    this->io_sample_rate_ratio_ = io_sample_rate_ratio;
    dVar5 = anon_unknown_3::SincScaleFactor(this->io_sample_rate_ratio_);
    for (i = 0; i < 0x21; i = i + 1) {
      for (idx = 0; idx < 0x20; idx = idx + 1) {
        __i = idx + i * 0x20;
        pfVar3 = std::unique_ptr<float[],_webrtc::AlignedFreeDeleter>::operator[]
                           (&this->kernel_window_storage_,__i);
        fVar1 = *pfVar3;
        pfVar3 = std::unique_ptr<float[],_webrtc::AlignedFreeDeleter>::operator[]
                           (&this->kernel_pre_sinc_storage_,__i);
        fVar2 = *pfVar3;
        if ((fVar2 != 0.0) || (local_60 = dVar5, NAN(fVar2))) {
          dVar4 = sin(dVar5 * (double)fVar2);
          local_60 = dVar4 / (double)fVar2;
        }
        pfVar3 = std::unique_ptr<float[],_webrtc::AlignedFreeDeleter>::operator[]
                           (&this->kernel_storage_,__i);
        *pfVar3 = (float)((double)fVar1 * local_60);
      }
    }
  }
  return;
}

Assistant:

void SincResampler::SetRatio(double io_sample_rate_ratio) {
  if (fabs(io_sample_rate_ratio_ - io_sample_rate_ratio) <
      std::numeric_limits<double>::epsilon()) {
    return;
  }

  io_sample_rate_ratio_ = io_sample_rate_ratio;

  // Optimize reinitialization by reusing values which are independent of
  // |sinc_scale_factor|.  Provides a 3x speedup.
  const double sinc_scale_factor = SincScaleFactor(io_sample_rate_ratio_);
  for (size_t offset_idx = 0; offset_idx <= kKernelOffsetCount; ++offset_idx) {
    for (size_t i = 0; i < kKernelSize; ++i) {
      const size_t idx = i + offset_idx * kKernelSize;
      const float window = kernel_window_storage_[idx];
      const float pre_sinc = kernel_pre_sinc_storage_[idx];

      kernel_storage_[idx] = static_cast<float>(window *
          ((pre_sinc == 0) ?
              sinc_scale_factor :
              (sin(sinc_scale_factor * pre_sinc) / pre_sinc)));
    }
  }
}